

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer_OpenGL_4.c
# Opt level: O2

GPU_Renderer * GPU_CreateRenderer_OpenGL_4(GPU_RendererID request)

{
  GPU_Renderer *pGVar1;
  GPU_RendererImpl *pGVar2;
  
  pGVar1 = (GPU_Renderer *)SDL_malloc(0x68);
  if (pGVar1 != (GPU_Renderer *)0x0) {
    *(undefined8 *)&pGVar1->default_image_anchor_y = 0;
    pGVar1->impl = (GPU_RendererImpl *)0x0;
    pGVar1->current_context_target = (GPU_Target *)0x0;
    pGVar1->coordinate_mode = false;
    *(undefined3 *)&pGVar1->field_0x51 = 0;
    pGVar1->default_image_anchor_x = 0.0;
    pGVar1->shader_language = GPU_LANGUAGE_NONE;
    pGVar1->min_shader_version = 0;
    pGVar1->max_shader_version = 0;
    pGVar1->enabled_features = 0;
    *(undefined8 *)&(pGVar1->requested_id).minor_version = 0;
    pGVar1->SDL_init_flags = 0;
    pGVar1->GPU_init_flags = 0;
    (pGVar1->requested_id).name = (char *)0x0;
    (pGVar1->requested_id).renderer = 0;
    (pGVar1->requested_id).major_version = 0;
    (pGVar1->id).name = request.name;
    (pGVar1->id).renderer = request.renderer;
    (pGVar1->id).major_version = request.major_version;
    (pGVar1->id).minor_version = request.minor_version;
    *(undefined4 *)&(pGVar1->id).field_0x14 = request._20_4_;
    (pGVar1->id).renderer = 5;
    pGVar1->shader_language = GPU_LANGUAGE_GLSL;
    pGVar1->min_shader_version = 0x6e;
    pGVar1->max_shader_version = 0x96;
    pGVar1->default_image_anchor_x = 0.5;
    pGVar1->default_image_anchor_y = 0.5;
    pGVar2 = (GPU_RendererImpl *)SDL_malloc(0x310);
    pGVar1->impl = pGVar2;
    memset(pGVar2,0,0x310);
    pGVar2 = pGVar1->impl;
    pGVar2->Init = Init;
    pGVar2->CreateTargetFromWindow = CreateTargetFromWindow;
    pGVar2->CreateAliasTarget = CreateAliasTarget;
    pGVar2->MakeCurrent = MakeCurrent;
    pGVar2->SetAsCurrent = SetAsCurrent;
    pGVar2->ResetRendererState = ResetRendererState;
    pGVar2->AddDepthBuffer = AddDepthBuffer;
    pGVar2->SetWindowResolution = SetWindowResolution;
    pGVar2->SetVirtualResolution = SetVirtualResolution;
    pGVar2->UnsetVirtualResolution = UnsetVirtualResolution;
    pGVar2->Quit = Quit;
    pGVar2->SetFullscreen = SetFullscreen;
    pGVar2->SetCamera = SetCamera;
    pGVar2->CreateImage = CreateImage;
    pGVar2->CreateImageUsingTexture = CreateImageUsingTexture;
    pGVar2->CreateAliasImage = CreateAliasImage;
    pGVar2->SaveImage = SaveImage;
    pGVar2->CopyImage = CopyImage;
    pGVar2->UpdateImage = UpdateImage;
    pGVar2->UpdateImageBytes = UpdateImageBytes;
    pGVar2->ReplaceImage = ReplaceImage;
    pGVar2->CopyImageFromSurface = CopyImageFromSurface;
    pGVar2->CopyImageFromTarget = CopyImageFromTarget;
    pGVar2->CopySurfaceFromTarget = CopySurfaceFromTarget;
    pGVar2->CopySurfaceFromImage = CopySurfaceFromImage;
    pGVar2->FreeImage = FreeImage;
    pGVar2->GetTarget = GetTarget;
    pGVar2->FreeTarget = FreeTarget;
    pGVar2->Blit = Blit;
    pGVar2->BlitRotate = BlitRotate;
    pGVar2->BlitScale = BlitScale;
    pGVar2->BlitTransform = BlitTransform;
    pGVar2->BlitTransformX = BlitTransformX;
    pGVar2->PrimitiveBatchV = PrimitiveBatchV;
    pGVar2->GenerateMipmaps = GenerateMipmaps;
    pGVar2->SetClip = SetClip;
    pGVar2->UnsetClip = UnsetClip;
    pGVar2->GetPixel = GetPixel;
    pGVar2->SetImageFilter = SetImageFilter;
    pGVar2->SetWrapMode = SetWrapMode;
    pGVar2->GetTextureHandle = GetTextureHandle;
    pGVar2->ClearRGBA = ClearRGBA;
    pGVar2->FlushBlitBuffer = FlushBlitBuffer;
    pGVar2->Flip = Flip;
    pGVar2->CompileShader_RW = CompileShader_RW;
    pGVar2->CompileShader = CompileShader;
    pGVar2->CreateShaderProgram = CreateShaderProgram;
    pGVar2->LinkShaderProgram = LinkShaderProgram;
    pGVar2->FreeShader = FreeShader;
    pGVar2->FreeShaderProgram = FreeShaderProgram;
    pGVar2->AttachShader = AttachShader;
    pGVar2->DetachShader = DetachShader;
    pGVar2->ActivateShaderProgram = ActivateShaderProgram;
    pGVar2->DeactivateShaderProgram = DeactivateShaderProgram;
    pGVar2->GetShaderMessage = GetShaderMessage;
    pGVar2->GetAttributeLocation = GetAttributeLocation;
    pGVar2->GetUniformLocation = GetUniformLocation;
    pGVar2->LoadShaderBlock = LoadShaderBlock;
    pGVar2->SetShaderImage = SetShaderImage;
    pGVar2->GetUniformiv = GetUniformiv;
    pGVar2->SetUniformi = SetUniformi;
    pGVar2->SetUniformiv = SetUniformiv;
    pGVar2->GetUniformuiv = GetUniformuiv;
    pGVar2->SetUniformui = SetUniformui;
    pGVar2->SetUniformuiv = SetUniformuiv;
    pGVar2->GetUniformfv = GetUniformfv;
    pGVar2->SetUniformf = SetUniformf;
    pGVar2->SetUniformfv = SetUniformfv;
    pGVar2->SetUniformMatrixfv = SetUniformMatrixfv;
    pGVar2->SetAttributef = SetAttributef;
    pGVar2->SetAttributei = SetAttributei;
    pGVar2->SetAttributeui = SetAttributeui;
    pGVar2->SetAttributefv = SetAttributefv;
    pGVar2->SetAttributeiv = SetAttributeiv;
    pGVar2->SetAttributeuiv = SetAttributeuiv;
    pGVar2->SetAttributeSource = SetAttributeSource;
    pGVar2->SetLineThickness = SetLineThickness;
    pGVar2->GetLineThickness = GetLineThickness;
    pGVar2->Pixel = Pixel;
    pGVar2->Line = Line;
    pGVar2->Arc = Arc;
    pGVar2->ArcFilled = ArcFilled;
    pGVar2->Circle = Circle;
    pGVar2->CircleFilled = CircleFilled;
    pGVar2->Ellipse = Ellipse;
    pGVar2->EllipseFilled = EllipseFilled;
    pGVar2->Sector = Sector;
    pGVar2->SectorFilled = SectorFilled;
    pGVar2->Tri = Tri;
    pGVar2->TriFilled = TriFilled;
    pGVar2->Rectangle = Rectangle;
    pGVar2->RectangleFilled = RectangleFilled;
    pGVar2->RectangleRound = RectangleRound;
    pGVar2->RectangleRoundFilled = RectangleRoundFilled;
    pGVar2->Polygon = Polygon;
    pGVar2->Polyline = Polyline;
    pGVar2->PolygonFilled = PolygonFilled;
  }
  return pGVar1;
}

Assistant:

GPU_Renderer* GPU_CreateRenderer_OpenGL_4(GPU_RendererID request)
{
    GPU_Renderer* renderer = (GPU_Renderer*)SDL_malloc(sizeof(GPU_Renderer));
    if(renderer == NULL)
        return NULL;

    memset(renderer, 0, sizeof(GPU_Renderer));

    renderer->id = request;
    renderer->id.renderer = GPU_RENDERER_OPENGL_4;
    renderer->shader_language = GPU_LANGUAGE_GLSL;
    renderer->min_shader_version = 110;
    renderer->max_shader_version = SDL_GPU_GLSL_VERSION;
    
    renderer->default_image_anchor_x = 0.5f;
    renderer->default_image_anchor_y = 0.5f;
    
    renderer->current_context_target = NULL;
    
    renderer->impl = (GPU_RendererImpl*)SDL_malloc(sizeof(GPU_RendererImpl));
    memset(renderer->impl, 0, sizeof(GPU_RendererImpl));
    SET_COMMON_FUNCTIONS(renderer->impl);

    return renderer;
}